

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O1

void __thiscall OrderGrid::paintEvent(OrderGrid *this,QPaintEvent *evt)

{
  CellPainter *this_00;
  CachedPen *this_01;
  OrderGrid *pOVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int extraout_var;
  OrderRow *pOVar8;
  Spec SVar9;
  long lVar10;
  QPainter painter;
  OrderRow row;
  QRect local_70;
  QColor local_60;
  QColor *local_50;
  QColor *local_48;
  OrderGrid *local_40;
  Order *local_38;
  
  QPainter::QPainter((QPainter *)&local_70,(QPaintDevice *)&this->field_0x10);
  this_00 = &this->mCellPainter;
  iVar4 = CellPainter::cellWidth(this_00);
  local_70.x2 = CellPainter::cellHeight(this_00);
  local_70.y2 = extraout_var;
  iVar5 = PatternModel::cursorPattern(this->mModel);
  local_38 = PatternModel::order(this->mModel);
  bVar2 = QWidget::hasFocus();
  iVar7 = this->mPatternStart;
  bVar3 = PatternModel::isPlaying(this->mModel);
  if ((bVar3) &&
     (iVar6 = PatternModel::trackerCursorPattern(this->mModel), (bVar2 & iVar6 == iVar5) == 0)) {
    local_60.ct._0_4_ = (iVar6 - this->mPatternStart) * local_70.x2;
    local_60.cspec = (this->mGridRect).x1;
    local_60.ct._4_4_ = (this->mGridRect).x2;
    local_60._12_4_ = local_70.x2 + -1 + local_60.ct._0_4_;
    QPainter::fillRect(&local_70,&local_60);
  }
  iVar7 = (iVar5 - iVar7) * local_70.x2;
  if (bVar2 != 0) {
    local_60.cspec = (this->mGridRect).x1;
    local_60.ct._4_4_ = (this->mGridRect).x2;
    local_60._12_4_ = local_70.x2 + -1 + iVar7;
    local_60.ct._0_4_ = iVar7;
    QPainter::fillRect(&local_70,&local_60);
  }
  local_40 = this;
  if (this->mChangeAll == true) {
    iVar5 = (this->mGridRect).x1;
    iVar6 = 0;
    if (this->mHighNibble == false) {
      iVar6 = iVar4;
    }
    SVar9 = iVar5 + iVar4 + iVar6;
    local_48 = &this->mCursorColor;
    local_50 = (QColor *)CONCAT44(local_50._4_4_,local_70.x2 + iVar7 + -1);
    iVar5 = iVar6 + iVar5 + iVar4 * 2 + -1;
    iVar6 = 4;
    do {
      local_60._12_4_ = (int)local_50;
      local_60.cspec = SVar9;
      local_60.ct._0_4_ = iVar7;
      local_60.ct._4_4_ = iVar5;
      QPainter::fillRect(&local_70,&local_60);
      SVar9 = SVar9 + iVar4 * 3;
      iVar5 = iVar5 + iVar4 * 3;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  else {
    local_60.cspec = cursorX(this);
    local_60.ct._4_4_ = iVar4 + -1 + local_60.cspec;
    local_60._12_4_ = local_70.x2 + -1 + iVar7;
    local_60.ct._0_4_ = iVar7;
    QPainter::fillRect(&local_70,&local_60);
  }
  iVar7 = local_40->mPatternStart;
  if (iVar7 < local_40->mPatternEnd) {
    this_01 = &local_40->mPen;
    local_48 = &local_40->mRownoColor;
    local_50 = &local_40->mTextColor;
    iVar5 = 0;
    do {
      pOVar1 = local_40;
      CachedPen::get(this_01,local_48);
      QPainter::setPen((QPen *)&local_70);
      CellPainter::drawHex(this_00,(QPainter *)&local_70,iVar7,4,iVar5);
      CachedPen::get(this_01,local_50);
      QPainter::setPen((QPen *)&local_70);
      pOVar8 = trackerboy::Order::operator[](local_38,iVar7);
      local_60.cspec = *(Spec *)pOVar8->_M_elems;
      iVar6 = (pOVar1->mGridRect).x1;
      lVar10 = 0;
      do {
        iVar6 = CellPainter::drawHex
                          (this_00,(QPainter *)&local_70,
                           (uint)*(byte *)((long)&local_60.cspec + lVar10),iVar6 + iVar4,iVar5);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      iVar5 = iVar5 + local_70.x2;
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_40->mPatternEnd);
  }
  local_60.cspec = (local_40->mGridRect).x1 - Rgb;
  local_60._12_4_ = (local_40->mGridRect).y2 - (local_40->mGridRect).y1;
  local_60.ct._0_4_ = 0;
  local_60.ct._4_4_ = local_60.cspec;
  QPainter::fillRect(&local_70,&local_60);
  QPainter::~QPainter((QPainter *)&local_70);
  return;
}

Assistant:

void OrderGrid::paintEvent(QPaintEvent *evt) {
    Q_UNUSED(evt)

    QPainter painter(this);

    auto const cellWidth = mCellPainter.cellWidth();
    auto const cellHeight = mCellPainter.cellHeight();
    auto const cursorPattern = mModel.cursorPattern();
    auto const& order = mModel.order();
    auto const _hasFocus = hasFocus();

    int cursorYpos = (cursorPattern - mPatternStart) * cellHeight;

    if (mModel.isPlaying()) {
        auto trackerPos = mModel.trackerCursorPattern();
        // draw the tracker position except when the editor has focus and
        // the tracker position is equal to the cursor
        if (trackerPos != cursorPattern || !_hasFocus) {
            painter.fillRect(
                mGridRect.x(),
                (trackerPos - mPatternStart) * cellHeight,
                mGridRect.width(),
                cellHeight,
                mTrackerColor
            );
        }
    }

    // cursor row background
    if (_hasFocus) {
        painter.fillRect(mGridRect.x(), cursorYpos, mGridRect.width(), cellHeight, mRowColor);
    }

    // cursor
    if (mChangeAll) {
        int xpos = mGridRect.x() + cellWidth;
        if (!mHighNibble) {
            xpos += cellWidth;
        }
        int gap = cellWidth * 3;
        for (int i = 0; i < 4; ++i) {
            painter.fillRect(xpos, cursorYpos, cellWidth, cellHeight, mCursorColor);
            xpos += gap;
        }
    
    } else {
        painter.fillRect(cursorX(), cursorYpos, cellWidth, cellHeight, mCursorColor);
    }

    int ypos = 0;
    for (int i = mPatternStart; i < mPatternEnd; ++i) {
        painter.setPen(mPen.get(mRownoColor));
        // rowno
        mCellPainter.drawHex(painter, i, SPACING, ypos);

        // order data
        painter.setPen(mPen.get(mTextColor));
        auto const row = order[i];
        int xpos = mGridRect.x();
        for (auto id : row) {
            xpos += cellWidth;
            xpos = mCellPainter.drawHex(painter, id, xpos, ypos);
        }

        ypos += cellHeight;
    }


    // line
    painter.fillRect(mGridRect.x() - LINE_WIDTH, 0, LINE_WIDTH, mGridRect.height(), mLineColor);
}